

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# burstsort.cpp
# Opt level: O2

uchar ** traverse<vector_block<unsigned_char*,1024u>,void(*)(unsigned_char**,int,int),unsigned_char>
                   (TrieNode<unsigned_char> *node,uchar **dst,size_t depth,
                   _func_void_uchar_ptr_ptr_int_int *small_sort)

{
  TrieNode<unsigned_char> *node_00;
  void *pvVar1;
  size_t __n;
  uchar **__dest;
  long lVar2;
  ulong uVar3;
  size_t i;
  ulong uVar4;
  
  uVar3 = 0;
  do {
    if (uVar3 == 0x100) {
      operator_delete(node);
      return dst;
    }
    node_00 = (TrieNode<unsigned_char> *)(node->buckets)._M_elems[uVar3];
    if (((node->is_trie).super__Base_bitset<4UL>._M_w[uVar3 >> 6] >> (uVar3 & 0x3f) & 1) == 0) {
      if (node_00 != (TrieNode<unsigned_char> *)0x0) {
        pvVar1 = (node_00->buckets)._M_elems[0];
        small_sort = (_func_void_uchar_ptr_ptr_int_int *)(node_00->buckets)._M_elems[1];
        if ((long)small_sort - (long)pvVar1 == 0) {
          __assert_fail("not v._index_block.empty()",
                        "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/vector_block.h"
                        ,0x5b,
                        "void copy(const vector_block<T, B> &, OutputIterator) [T = unsigned char *, B = 1024U, OutputIterator = unsigned char **]"
                       );
        }
        lVar2 = ((long)small_sort - (long)pvVar1) * 0x80 -
                (ulong)*(uint *)((node_00->buckets)._M_elems + 4);
        __dest = dst;
        for (uVar4 = 1; uVar4 < (ulong)((long)small_sort - (long)pvVar1 >> 3); uVar4 = uVar4 + 1) {
          memmove(__dest,*(void **)((long)pvVar1 + uVar4 * 8 + -8),0x2000);
          __dest = __dest + 0x400;
          pvVar1 = (node_00->buckets)._M_elems[0];
          small_sort = (_func_void_uchar_ptr_ptr_int_int *)(node_00->buckets)._M_elems[1];
        }
        __n = (long)(node_00->buckets)._M_elems[3] - (long)*(void **)(small_sort + -8);
        if (__n != 0) {
          memmove(__dest,*(void **)(small_sort + -8),__n);
        }
        if (uVar3 != 0) {
          mkqsort(dst,(int)lVar2,(int)depth);
        }
        dst = dst + lVar2;
        vector_block<unsigned_char_*,_1024U>::~vector_block
                  ((vector_block<unsigned_char_*,_1024U> *)node_00);
        operator_delete(node_00);
      }
    }
    else {
      dst = traverse<vector_block<unsigned_char*,1024u>,void(*)(unsigned_char**,int,int),unsigned_char>
                      (node_00,dst,depth + 1,small_sort);
    }
    uVar3 = uVar3 + 1;
  } while( true );
}

Assistant:

static unsigned char**
traverse(TrieNode<CharT>* node,
         unsigned char** dst,
         size_t depth,
         SmallSort small_sort)
{
	for (unsigned i=0; i < max<CharT>::value; ++i) {
		if (node->is_trie[i]) {
			dst = traverse<BucketT>(
				static_cast<TrieNode<CharT>*>(node->buckets[i]),
				dst, depth+sizeof(CharT), small_sort);
		} else {
			BucketT* bucket =
				static_cast<BucketT*>(node->buckets[i]);
			if (not bucket) continue;
			size_t bsize = bucket->size();
			copy(*bucket, dst);
			if (not is_end(i)) small_sort(dst, bsize, depth);
			dst += bsize;
			delete bucket;
		}
	}
	delete node;
	return dst;
}